

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MockExpectedCall_callWithObjectParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithObjectParameter_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                                  ,0x14e);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002b6230;
  return this_00;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameterOfType("ClassName", paramName, value);
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstObjectPointer());
    STRCMP_EQUAL("ClassName", call->getInputParameterType(paramName).asCharString());
    STRCMP_CONTAINS("funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">", call->callToString().asCharString());
}